

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Coproduct.hpp
# Opt level: O2

Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
* __thiscall
Lib::
Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>>>>>>>
::variant<0u>(Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
              *__return_storage_ptr__,
             Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>,Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier*,Indexing::LiteralClause>>>>>>>>
             *this,Get<0U,_Ts>_conflict *value)

{
  int iVar1;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
  *pDVar2;
  VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
  local_18;
  VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>
  local_10;
  
  local_18._core =
       *(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_> **
        )this;
  if (local_18._core ==
      (IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_> *)
      0x0) {
    pDVar2 = &(__return_storage_ptr__->_inner).
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
    ;
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xf] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x10] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x11] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x12] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x13] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x14] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x15] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x16] = '\0';
    *(undefined8 *)
     ((__return_storage_ptr__->_inner).
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
      .
      super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
      ._content + 0x17) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->_inner).
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
      .
      super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
         = 0;
    pDVar2 = &(__return_storage_ptr__->_inner).
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
    ;
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[7] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[8] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[9] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[10] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xb] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xc] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xd] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xe] = '\0';
  }
  else {
    iVar1 = (local_18._core)->_refCnt;
    pDVar2 = &(__return_storage_ptr__->_inner).
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
    ;
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xf] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x10] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x11] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x12] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x13] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x14] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x15] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0x16] = '\0';
    *(undefined8 *)
     ((__return_storage_ptr__->_inner).
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
      .
      super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
      ._content + 0x17) = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->_inner).
      super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
      .
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
      .
      super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
         = 0;
    pDVar2 = &(__return_storage_ptr__->_inner).
              super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
              .
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
    ;
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[7] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[8] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[9] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[10] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xb] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xc] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xd] = '\0';
    (pDVar2->
    super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
    )._content[0xe] = '\0';
    (local_18._core)->_refCnt = iVar1 + 3;
  }
  *(IteratorCore<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_> **)
   (__return_storage_ptr__->_inner).
   super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>_>
   .
   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>_>
   .
   super_RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>_>_>_>_>_>_>
   ._content = local_18._core;
  local_10._core = local_18._core;
  VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>::
  ~VirtualIterator(&local_10);
  VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Indexing::LiteralClause>_>::
  ~VirtualIterator(&local_18);
  return __return_storage_ptr__;
}

Assistant:

static Coproduct variant(TL::Get<idx, Ts> value)
  { return Coproduct(Variant<idx, TL::Get<idx, Ts>>(move_if_value<TL::Get<idx, Ts>>(value))); }